

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O3

int __thiscall Mempool::get_list_size_byte(Mempool *this,MEM_CAP index)

{
  int iVar1;
  iterator iVar2;
  mapped_type *ppCVar3;
  mapped_type pCVar4;
  MEM_CAP local_20;
  MEM_CAP local_1c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mp_mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_1c = index;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&local_1c);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Chunk_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    local_20 = index;
    ppCVar3 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_20);
    iVar1 = 0;
    for (pCVar4 = *ppCVar3; pCVar4 != (mapped_type)0x0; pCVar4 = pCVar4->next) {
      iVar1 = iVar1 + pCVar4->capacity;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return iVar1;
  }
  __assert_fail("mp_pool.find(index) != mp_pool.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                ,0x62,"int Mempool::get_list_size_byte(MEM_CAP)");
}

Assistant:

int Mempool::get_list_size_byte(MEM_CAP index)
{
    int size = 0;
    lock_guard<mutex> lck(mp_mutex);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while(node)
    {
        size += node->capacity;
        node = node->next;
    } 

    return size;
}